

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

int fy_node_hash_uint(fy_node *fyn,uint *hashp)

{
  uint uVar1;
  undefined1 local_50 [4];
  int rc;
  XXH32_state_t state;
  uint *hashp_local;
  fy_node *fyn_local;
  
  state.ll[5] = (longlong)hashp;
  XXH32_reset((XXH32_state_t *)local_50,0x9e3779b1);
  fyn_local._4_4_ = fy_node_hash_internal(fyn,update_xx32,local_50);
  if (fyn_local._4_4_ == 0) {
    uVar1 = XXH32_digest((XXH32_state_t *)local_50);
    *(uint *)state.ll[5] = uVar1;
    fyn_local._4_4_ = 0;
  }
  return fyn_local._4_4_;
}

Assistant:

int fy_node_hash_uint(struct fy_node *fyn, unsigned int *hashp) {
    XXH32_state_t state;
    int rc;

    XXH32_reset(&state, 2654435761U);

    rc = fy_node_hash_internal(fyn, update_xx32, &state);
    if (rc)
        return rc;

    *hashp = XXH32_digest(&state);
    return 0;
}